

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O3

int h261_block(bitstream *str,int32_t *block,int intra)

{
  uint uVar1;
  vs_vlc_val *pvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  vs_vlc_val *pvVar6;
  vs_vlc_val *tab;
  uint uVar7;
  vs_vlc_val *pvVar8;
  long lVar9;
  uint32_t tmp;
  uint32_t sign;
  uint32_t eb;
  uint32_t local_40;
  uint32_t local_3c;
  uint local_38;
  uint local_34;
  
  if (intra == 0) {
    iVar3 = 0;
  }
  else {
    local_40 = *block;
    if (str->dir == VS_ENCODE) {
      if (local_40 - 0xff < 0xffffff02) {
        h261_block_cold_2();
        return 1;
      }
      if (local_40 == 0x80) {
        local_40 = 0xff;
      }
    }
    iVar3 = vs_u(str,&local_40,8);
    if (iVar3 != 0) {
      return 1;
    }
    if (str->dir == VS_DECODE) {
      if ((local_40 & 0xffffff7f) == 0) {
        h261_block_cold_1();
        return 1;
      }
      uVar4 = 0x80;
      if (local_40 != 0xff) {
        uVar4 = local_40;
      }
      *block = uVar4;
    }
    iVar3 = 1;
  }
  do {
    tab = block_vlc;
    if (iVar3 == 0) {
      tab = block_0_vlc;
    }
    if (str->dir == VS_ENCODE) {
      if (iVar3 < 0x40) {
        local_3c = 0x40 - iVar3;
        uVar4 = 0;
        lVar9 = 0;
        do {
          if (block[iVar3 + lVar9] != 0) {
            local_3c = (uint32_t)lVar9;
            iVar3 = iVar3 + local_3c;
            goto LAB_00102552;
          }
          lVar9 = lVar9 + 1;
          uVar4 = uVar4 + 0x1000;
        } while (0x40 - (long)iVar3 != lVar9);
      }
      else {
        local_3c = 0;
        uVar4 = 0;
        if (iVar3 != 0x40) {
LAB_00102552:
          uVar1 = block[iVar3];
          uVar7 = -uVar1;
          if (0 < (int)uVar1) {
            uVar7 = uVar1;
          }
          if (0x7f < uVar7) {
            h261_block_cold_3();
            return 1;
          }
          local_40 = uVar7 | uVar4;
          local_38 = uVar1 >> 0x1f;
          pvVar6 = tab;
          do {
            pvVar8 = pvVar6;
            if (pvVar6->val == local_40) break;
            pvVar8 = pvVar6 + 1;
            pvVar2 = pvVar6 + 1;
            pvVar6 = pvVar8;
          } while (pvVar2->blen != 0);
          if (local_40 != (pvVar8->val == 0)) {
            local_40 = 0xfffff;
          }
          local_34 = uVar1 & 0xff;
          iVar3 = iVar3 + 1;
          goto LAB_001025b7;
        }
      }
      local_40 = 0;
      iVar3 = 0x40;
    }
LAB_001025b7:
    iVar5 = vs_vlc(str,&local_40,tab);
    if (iVar5 != 0) {
      return 1;
    }
    if (local_40 == 0xfffff) {
      iVar5 = vs_u(str,&local_3c,6);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = vs_u(str,&local_34,8);
      if (iVar5 != 0) {
        return 1;
      }
      if ((local_34 & 0xffffff7f) == 0) {
        h261_block_cold_4();
        return 1;
      }
      uVar4 = local_34 | 0xffffff00;
      if ((int)local_34 < 0x81) {
        uVar4 = local_34;
      }
    }
    else {
      if (local_40 == 0) {
        if (str->dir != VS_DECODE) {
          return 0;
        }
        if (iVar3 < 0x40) {
          memset(block + iVar3,0,(ulong)(0x3f - iVar3) * 4 + 4);
          return 0;
        }
        return 0;
      }
      iVar5 = vs_u(str,&local_38,1);
      if (iVar5 != 0) {
        return 1;
      }
      local_3c = local_40 >> 0xc;
      uVar4 = -(local_40 & 0xfff);
      if (local_38 == 0) {
        uVar4 = local_40 & 0xfff;
      }
    }
    if (str->dir == VS_DECODE) {
      if (0x3f < iVar3) {
        h261_block_cold_6();
        return 1;
      }
      if (local_3c != 0) {
        lVar9 = 0;
        do {
          if (0x40 - (long)iVar3 == lVar9) {
            h261_block_cold_5();
            return 1;
          }
          block[iVar3 + lVar9] = 0;
          lVar9 = lVar9 + 1;
        } while (local_3c != (uint)lVar9);
        iVar3 = iVar3 + (uint)lVar9;
      }
      lVar9 = (long)iVar3;
      iVar3 = iVar3 + 1;
      block[lVar9] = uVar4;
    }
  } while( true );
}

Assistant:

int h261_block(struct bitstream *str, int32_t *block, int intra) {
	int i = 0;
	if (intra) {
		uint32_t val = block[0];
		if (str->dir == VS_ENCODE) {
			if (val >= 0xff || val == 0) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0x80)
				val = 0xff;
		}
		if (vs_u(str, &val, 8)) return 1;
		if (str->dir == VS_DECODE) {
			if (val == 0 || val == 0x80) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0xff)
				val = 0x80;
			block[0] = val;
		}
		i = 1;
	}
	while (1) {
		uint32_t tmp, run, eb, sign;
		int32_t coeff;
		const struct vs_vlc_val *tab;
		if (i == 0)
			tab = block_0_vlc;
		else
			tab = block_vlc;
		if (str->dir == VS_ENCODE) {
			run = 0;
			while (i < 64 && !block[i])
				i++, run++;
			if (i == 64) {
				tmp = 0;
			} else {
				coeff = block[i];
				if (abs(coeff) > 127) {
					fprintf(stderr, "Coeff too large\n");
					return 1;
				}
				tmp = abs(coeff) | run << 12;
				sign = coeff < 0;
				int j;
				for (j = 0; tab[j].blen; j++) {
					if (tab[j].val == tmp) {
						break;
					}
				}
				if (!tab[j].val != tmp)
					tmp = 0xfffff;
				eb = coeff & 0xff;
				i++;
			}
		}
		if (vs_vlc(str, &tmp, tab)) return 1;
		if (tmp == 0) {
			/* end of block */
			if (str->dir == VS_DECODE) {
				while (i < 64)
					block[i++] = 0;
			}
			return 0;
		} else if (tmp == 0xfffff) {
			/* escape */
			if (vs_u(str, &run, 6)) return 1;
			if (vs_u(str, &eb, 8)) return 1;
			if (eb == 0 || eb == 0x80) {
				fprintf(stderr, "Invalid escape code\n");
				return 1;
			}
			coeff = eb;
			if (coeff > 0x80)
				coeff |= -0x100;
		} else {
			/* normal coefficient */
			if (vs_u(str, &sign, 1)) return 1;
			run = tmp >> 12;
			if (sign)
				coeff = -(tmp & 0xfff);
			else
				coeff = tmp & 0xfff;
		}
		if (str->dir == VS_DECODE) {
			if (i >= 64) {
				fprintf(stderr, "block overflow\n");
				return 1;
			}
			while (run--) {
				if (i >= 64) {
					fprintf(stderr, "block overflow\n");
					return 1;
				}
				block[i++] = 0;
			}
			block[i++] = coeff;
		}
	}
}